

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O2

StringList * __thiscall llbuild::basic::StringList::operator=(StringList *this,StringList *rhs)

{
  if (this != rhs) {
    this->size = rhs->size;
    if (this->contents != (char *)0x0) {
      operator_delete__(this->contents);
    }
    this->contents = rhs->contents;
    rhs->contents = (char *)0x0;
  }
  return this;
}

Assistant:

StringList& operator=(StringList&& rhs) {
    if (this != &rhs) {
      size = rhs.size;
      if (contents != nullptr)
        delete [] contents;
      contents = rhs.contents;
      rhs.contents = nullptr;
    }
    return *this;
  }